

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::RBCOMVisitor::visit(RBCOMVisitor *this,RigidBody *rb)

{
  element_type *peVar1;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  Vector3d pos;
  allocator<char> local_99;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_88;
  Vector<double,_3U> local_78;
  __shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_48;
  Vector<double,_3U> local_38;
  
  local_88._M_ptr = (element_type *)0x0;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98._M_ptr = (element_type *)0x0;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Vector<double,_3U>::Vector(&local_38);
  StuntDouble::getPos((Vector3d *)&local_78,&rb->super_StuntDouble);
  Vector<double,_3U>::operator=(&local_38,&local_78);
  std::make_shared<OpenMD::AtomInfo>();
  std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_98,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78.data_ + 1));
  std::__cxx11::string::assign((char *)local_98._M_ptr);
  ((local_98._M_ptr)->pos).super_Vector<double,_3U>.data_[0] = local_38.data_[0];
  ((local_98._M_ptr)->pos).super_Vector<double,_3U>.data_[1] = local_38.data_[1];
  ((local_98._M_ptr)->pos).super_Vector<double,_3U>.data_[2] = local_38.data_[2];
  ((local_98._M_ptr)->vec).super_Vector<double,_3U>.data_[0] = 0.0;
  ((local_98._M_ptr)->vec).super_Vector<double,_3U>.data_[1] = 0.0;
  ((local_98._M_ptr)->vec).super_Vector<double,_3U>.data_[2] = 0.0;
  std::make_shared<OpenMD::AtomData>();
  std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_88,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78.data_ + 1));
  peVar1 = local_88._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ATOMDATA",&local_99);
  std::__cxx11::string::_M_assign((string *)&(peVar1->super_GenericData).id_);
  std::__cxx11::string::~string((string *)&local_78);
  peVar1 = local_88._M_ptr;
  std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_48,&local_98)
  ;
  std::
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
  push_back(&peVar1->data,(value_type *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<OpenMD::AtomData,void>(local_58,&local_88);
  StuntDouble::addProperty(&rb->super_StuntDouble,(shared_ptr<OpenMD::GenericData> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  return;
}

Assistant:

void RBCOMVisitor::visit(RigidBody* rb) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    Vector3d pos;
    pos = rb->getPos();

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = "X";
    atomInfo->pos[0]       = pos[0];
    atomInfo->pos[1]       = pos[1];
    atomInfo->pos[2]       = pos[2];
    atomInfo->vec[0]       = 0;
    atomInfo->vec[1]       = 0;
    atomInfo->vec[2]       = 0;

    atomData = std::make_shared<AtomData>();
    atomData->setID("ATOMDATA");
    atomData->addAtomInfo(atomInfo);

    rb->addProperty(atomData);
  }